

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O0

undefined8 __thiscall ObjectFileRecord::to_unique_name_abi_cxx11_(ObjectFileRecord *this)

{
  undefined8 in_RDI;
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  string local_30 [12];
  int in_stack_ffffffffffffffdc;
  
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::to_string(in_stack_ffffffffffffffdc);
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string ObjectFileRecord::to_unique_name() const {
  return name + "-v" + std::to_string(version);
}